

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O1

void * FilterRender::doFlip(void *data,uint width,uint height,bool isLR)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int i;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int i_1;
  
  uVar4 = (ulong)width;
  uVar9 = (ulong)height;
  pvVar5 = operator_new__(uVar9 * 8);
  if (height != 0) {
    uVar7 = 0;
    do {
      pvVar6 = operator_new__(uVar4 * 8);
      *(void **)((long)pvVar5 + uVar7 * 8) = pvVar6;
      if (width != 0) {
        uVar10 = 0;
        do {
          pvVar6 = operator_new__(4);
          *(void **)(*(long *)((long)pvVar5 + uVar7 * 8) + uVar10 * 8) = pvVar6;
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar9);
    uVar7 = 0;
    pvVar6 = data;
    do {
      if (width != 0) {
        uVar10 = 0;
        do {
          lVar8 = 0;
          do {
            *(undefined1 *)(*(long *)(*(long *)((long)pvVar5 + uVar7 * 8) + uVar10 * 8) + lVar8) =
                 *(undefined1 *)((long)pvVar6 + lVar8);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          pvVar6 = (void *)((long)pvVar6 + 4);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar9);
  }
  if (isLR) {
    if (height == 0) goto LAB_001058de;
    uVar7 = 0;
    do {
      if (1 < width) {
        uVar10 = 0;
        do {
          lVar8 = 0;
          do {
            lVar2 = *(long *)((long)pvVar5 + uVar7 * 8);
            lVar3 = *(long *)(lVar2 + uVar10 * 8);
            lVar2 = *(long *)(lVar2 + (ulong)(width - (int)uVar10) * 8);
            uVar1 = *(undefined1 *)(lVar3 + lVar8);
            *(undefined1 *)(lVar3 + lVar8) = *(undefined1 *)(lVar2 + lVar8);
            *(undefined1 *)(lVar2 + lVar8) = uVar1;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          uVar10 = uVar10 + 1;
        } while (uVar10 != width >> 1);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar9);
  }
  else if (1 < height) {
    uVar7 = 0;
    do {
      if (width != 0) {
        uVar10 = 0;
        do {
          lVar8 = 0;
          do {
            lVar2 = *(long *)(*(long *)((long)pvVar5 + uVar7 * 8) + uVar10 * 8);
            lVar3 = *(long *)(*(long *)((long)pvVar5 + (ulong)(height - (int)uVar7) * 8) +
                             uVar10 * 8);
            uVar1 = *(undefined1 *)(lVar2 + lVar8);
            *(undefined1 *)(lVar2 + lVar8) = *(undefined1 *)(lVar3 + lVar8);
            *(undefined1 *)(lVar3 + lVar8) = uVar1;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != height >> 1);
  }
  if (height != 0) {
    uVar7 = 0;
    do {
      if (width != 0) {
        uVar10 = 0;
        do {
          lVar8 = 0;
          do {
            *(undefined1 *)((long)data + lVar8) =
                 *(undefined1 *)
                  (*(long *)(*(long *)((long)pvVar5 + uVar7 * 8) + uVar10 * 8) + lVar8);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          data = (void *)((long)data + 4);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar9);
    uVar7 = 0;
    do {
      if (width != 0) {
        uVar10 = 0;
        do {
          pvVar6 = *(void **)(*(long *)((long)pvVar5 + uVar7 * 8) + uVar10 * 8);
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
          }
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
      pvVar6 = *(void **)((long)pvVar5 + uVar7 * 8);
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar9);
  }
LAB_001058de:
  operator_delete__(pvVar5);
}

Assistant:

void* FilterRender::doFlip(void *data, uint width, uint height, bool isLR) {
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	if (isLR) {
		for (int i = 0; i < height; i++) {
			for (int j = 0; j < width / 2; j++) {
				for (int k = 0; k < 4; k++) {
					swap(map[i][j][k], map[i][width - j][k]);
				}
			}
		}
	} else {
		for (int i = 0; i < height / 2; i++) {
			for (int j = 0; j < width; j++) {
				for (int k = 0; k < 4; k++) {
					swap(map[i][j][k], map[height - i][j][k]);
				}
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}